

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O0

void __thiscall MetaSim::GenericVar::readPDF(GenericVar *this,ifstream *f,int mode)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  int in_EDX;
  void *in_RSI;
  string *in_RDI;
  double dVar6;
  string errMsg_1;
  string errMsg;
  double sum;
  double p;
  int n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  allocator *paVar7;
  key_type *in_stack_fffffffffffffe88;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea8;
  undefined2 in_stack_fffffffffffffeac;
  undefined1 in_stack_fffffffffffffeae;
  undefined1 uVar8;
  allocator in_stack_fffffffffffffeaf;
  Exc *in_stack_fffffffffffffeb0;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  string local_a0 [55];
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  void *local_10;
  
  local_28 = 0.0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while( true ) {
    do {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) {
        if (local_28 <= 1.0) {
          if (local_28 < 0.99999999999) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: PDF values sum to ");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_28);
            std::operator<<(poVar4," < 1\n");
            if (local_14 == 0) {
              dVar6 = 1.0 - local_28;
              pmVar5 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              *pmVar5 = dVar6 + *pmVar5;
            }
            else {
              dVar6 = 1.0 - local_28;
              pmVar5 = std::
                       map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                       ::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
              *pmVar5 = dVar6 + *pmVar5;
            }
          }
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"\n",&local_109);
        std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        uVar8 = 1;
        uVar3 = __cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_130,local_e8);
        paVar7 = (allocator *)&stack0xfffffffffffffeaf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,"GenericVar",paVar7);
        RandomVar::Exc::Exc(in_stack_fffffffffffffeb0,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffeaf,
                                     CONCAT16(uVar8,CONCAT24(in_stack_fffffffffffffeac,
                                                             in_stack_fffffffffffffea8))),in_RDI);
        __cxa_throw(uVar3,&RandomVar::Exc::typeinfo,RandomVar::Exc::~Exc);
      }
      std::istream::operator>>(local_10,&local_18);
      std::istream::operator>>(local_10,&local_20);
      uVar2 = std::ios::eof();
    } while ((uVar2 & 1) != 0);
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    dVar6 = local_20;
    if ((*pmVar5 != 0.0) || (NAN(*pmVar5))) break;
    local_28 = local_20 + local_28;
    pmVar5 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
             operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    *pmVar5 = dVar6;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"\n",&local_69);
  std::operator+(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_c2 = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_a0,local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"GenericVar",&local_c1);
  RandomVar::Exc::Exc(in_stack_fffffffffffffeb0,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffeaf,
                               CONCAT16(in_stack_fffffffffffffeae,
                                        CONCAT24(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                ))),in_RDI);
  local_c2 = 0;
  __cxa_throw(uVar3,&RandomVar::Exc::typeinfo,RandomVar::Exc::~Exc);
}

Assistant:

void GenericVar::readPDF(ifstream &f, int mode)
    {
        int n;
        double p;
        double sum;

        sum = 0;
        while(!f.eof()) {
            f >> n;
            f >> p;
#ifdef __DEBUG__
            cout << n << "\t" << p << "\n";
#endif
            if (!f.eof()) {
                if (_pdf[n] != 0) {
                    string errMsg = Exc::_WRONGPDF + string("\n");
                    throw Exc(errMsg, "GenericVar");
                }
                sum += p;
                _pdf[n] = p;
            }
        }

        if (sum > 1) {
            string errMsg = Exc::_WRONGPDF + string("\n");
            throw Exc(errMsg, "GenericVar");
        }

        if (sum < (1.0 - PDF_ERR)) {
            cerr << "Warning: PDF values sum to " << sum << " < 1\n";
            if (mode == 0) {
                _pdf[n] += (1 - sum);
            } else {
                _pdf[1] += (1 - sum);
            }
        }
    }